

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

long openjtalk_getCharCode(char *text)

{
  ulong uVar1;
  long lVar2;
  
  if (text == (char *)0x0) {
    return 0xc;
  }
  lVar2 = 0;
  uVar1 = 0;
  do {
    if ((ulong)(byte)text[lVar2] == 0) {
      return uVar1;
    }
    uVar1 = uVar1 << 8 | (ulong)(byte)text[lVar2];
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  return uVar1;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getCharCode(char *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char) * 8;
		res += ((long)*p) & 0xff;
		if (++count == 4)
		{
			break;
		}
	}
	return (long)res;
}